

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall google::protobuf::Message::MergeFrom(Message *this,Message *from)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  code *UNRECOVERED_JUMPTABLE;
  long lVar2;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[0x12])(from);
  if ((lVar2 == 0) || (lVar2 != CONCAT44(extraout_var_00,iVar1))) {
    UNRECOVERED_JUMPTABLE =
         MergeFrom(google::protobuf::Message_const&)::$_0::__invoke(google::protobuf::
         Message*,google::protobuf::Message_const__;
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)(lVar2 + 8);
  }
  (*UNRECOVERED_JUMPTABLE)(this,from);
  return;
}

Assistant:

void Message::MergeFrom(const Message& from) {
  auto* class_to = GetClassData();
  auto* class_from = from.GetClassData();
  auto* merge_to_from = class_to ? class_to->merge_to_from : nullptr;
  if (class_to == nullptr || class_to != class_from) {
    merge_to_from = [](Message* to, const Message& from) {
      ReflectionOps::Merge(from, to);
    };
  }
  merge_to_from(this, from);
}